

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_info.c
# Opt level: O2

MPP_RET hal_info_get(HalInfo ctx,MppDevInfoCfg *data,RK_S32 *size)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  RK_U64 RVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  long lStack_20;
  
  if (ctx == (HalInfo)0x0) {
    _mpp_log_l(2,(char *)0x0,"found NULL input ctx\n","hal_info_get");
  }
  else {
    if ((size != (RK_S32 *)0x0 && data != (MppDevInfoCfg *)0x0) && (iVar2 = *size, iVar2 != 0)) {
      uVar7 = *(uint *)((long)ctx + 8);
      if (uVar7 == 0) {
        *size = 0;
      }
      else {
        uVar3 = *ctx;
        if (uVar3 == 0) {
          lStack_20 = 6;
        }
        else {
          if (uVar3 != 1) {
            _mpp_log_l(2,(char *)0x0,"found invalid ctx type %d\n","hal_info_get",(ulong)uVar3);
            return MPP_ERR_VALUE;
          }
          lStack_20 = 0xb;
        }
        lVar8 = 0;
        iVar9 = 0;
        for (lVar6 = 0; lStack_20 != lVar6; lVar6 = lVar6 + 1) {
          if ((uVar7 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
            if (iVar2 < iVar9 + 0x10) {
              _mpp_log_l(2,(char *)0x0,"out data size %d is too small for %d\n","hal_info_get");
              break;
            }
            puVar1 = (undefined8 *)(*(long *)((long)ctx + 0x10) + lVar8);
            uVar4 = *puVar1;
            RVar5 = puVar1[1];
            data->type = (int)uVar4;
            data->flag = (int)((ulong)uVar4 >> 0x20);
            data->data = RVar5;
            data = data + 1;
            uVar7 = ~(1 << ((byte)lVar6 & 0x1f)) & *(uint *)((long)ctx + 8);
            *(uint *)((long)ctx + 8) = uVar7;
            iVar9 = iVar9 + 0x10;
          }
          lVar8 = lVar8 + 0x10;
        }
        *size = iVar9;
      }
      return MPP_OK;
    }
    _mpp_log_l(2,(char *)0x0,"found invalid output cfg data %p size %p\n","hal_info_get",data,size);
  }
  return MPP_ERR_NULL_PTR;
}

Assistant:

MPP_RET hal_info_get(HalInfo ctx, MppDevInfoCfg *data, RK_S32 *size)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input ctx\n");
        return MPP_ERR_NULL_PTR;
    }

    if (NULL == data || NULL == size || *size == 0) {
        mpp_err_f("found invalid output cfg data %p size %p\n", data, size);
        return MPP_ERR_NULL_PTR;
    }

    HalInfoImpl *info = (HalInfoImpl *)ctx;
    if (!info->updated) {
        *size = 0;
        return MPP_OK;
    }

    RK_S32 max_size = *size;
    RK_S32 elem_size = sizeof(info->elems[0]);
    RK_S32 out_size = 0;
    RK_S32 type_max = 0;
    RK_S32 i;

    switch (info->type) {
    case MPP_CTX_DEC : {
        type_max = DEC_INFO_BUTT - DEC_INFO_BASE;
    } break;
    case MPP_CTX_ENC : {
        type_max = ENC_INFO_BUTT - ENC_INFO_BASE;
    } break;
    default : {
        mpp_err_f("found invalid ctx type %d\n", info->type);
        return MPP_ERR_VALUE;
    } break;
    }

    for (i = 0; i < type_max; i++) {
        if (!(info->updated & (1 << i)))
            continue;

        if (out_size + elem_size > max_size) {
            mpp_err_f("out data size %d is too small for %d\n",
                      max_size, out_size + elem_size);
            break;
        }

        memcpy(data, &info->elems[i], elem_size);
        data++;
        out_size += elem_size;
        info->updated &= ~(1 << i);
    }

    *size = out_size;
    return MPP_OK;
}